

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O1

void __thiscall gutil::IOException::IOException(IOException *this,string *message)

{
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"IO exception","");
  gutil::Exception::Exception(&this->super_Exception,(string *)local_40,(string *)message);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  *(undefined ***)&this->super_Exception = &PTR__Exception_00126b38;
  return;
}

Assistant:

IOException(const std::string &message) :
      Exception("IO exception", message) { }